

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

xmlParserErrors
xmlParserInputBufferCreateUrl
          (char *URI,xmlCharEncoding enc,xmlParserInputFlags flags,xmlParserInputBufferPtr *out)

{
  code *pcVar1;
  xmlInputCloseCallback p_Var2;
  int iVar3;
  xmlParserInputBufferPtr buf;
  long lVar4;
  void *pvVar5;
  xmlParserInputFlags flags_00;
  int *piVar6;
  xmlParserErrors xVar7;
  ulong uVar8;
  int fd;
  int local_34;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    xVar7 = XML_ERR_ARGUMENT;
  }
  else {
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == (xmlParserInputBufferPtr)0x0) {
      xVar7 = XML_ERR_NO_MEMORY;
    }
    else {
      lVar4 = (long)xmlInputCallbackNr;
      xVar7 = XML_IO_ENOENT;
      if (0 < lVar4) {
        uVar8 = lVar4 + 1;
        piVar6 = &xmlInputCallbackNr + lVar4 * 8;
        do {
          pcVar1 = *(code **)(piVar6 + -4);
          if (pcVar1 == xmlIODefaultMatch) {
            xVar7 = xmlFdOpen(URI,0,&local_34);
            iVar3 = local_34;
            if (xVar7 == XML_ERR_OK) {
              xVar7 = xmlInputFromFd(buf,local_34,flags_00);
              close(iVar3);
            }
            if (xVar7 != XML_IO_ENOENT) {
              if (xVar7 == XML_ERR_OK) goto LAB_0015b81a;
              goto LAB_0015b80f;
            }
          }
          else if ((pcVar1 != (code *)0x0) && (iVar3 = (*pcVar1)(URI), iVar3 != 0)) {
            pvVar5 = (void *)(**(code **)(piVar6 + -2))(URI);
            buf->context = pvVar5;
            if (pvVar5 != (void *)0x0) {
              p_Var2 = *(xmlInputCloseCallback *)(piVar6 + 2);
              buf->readcallback = *(xmlInputReadCallback *)piVar6;
              buf->closecallback = p_Var2;
              xVar7 = XML_ERR_OK;
              goto LAB_0015b81a;
            }
          }
          uVar8 = uVar8 - 1;
          piVar6 = piVar6 + -8;
        } while (1 < uVar8);
        xVar7 = XML_IO_ENOENT;
      }
LAB_0015b80f:
      xmlFreeParserInputBuffer(buf);
      buf = (xmlParserInputBufferPtr)0x0;
LAB_0015b81a:
      *out = buf;
    }
  }
  return xVar7;
}

Assistant:

xmlParserErrors
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              xmlParserInputFlags flags,
                              xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserErrors ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}